

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  lws *plVar1;
  lws **local_20;
  lws **w;
  lws *wsi2;
  lws *wsi_local;
  
  local_20 = &(((wsi->mux).parent_wsi)->mux).child_list;
  do {
    if (*local_20 == (lws *)0x0) {
LAB_001207cf:
      plVar1 = (wsi->mux).parent_wsi;
      (plVar1->mux).child_count = (plVar1->mux).child_count - 1;
      (wsi->mux).parent_wsi = (lws *)0x0;
      return;
    }
    if (*local_20 == wsi) {
      plVar1 = ((*local_20)->mux).sibling_list;
      ((*local_20)->mux).sibling_list = (lws *)0x0;
      *local_20 = plVar1;
      _lws_log(0x10,"  %p disentangled from sibling %p\n",wsi,plVar1);
      goto LAB_001207cf;
    }
    local_20 = &((*local_20)->mux).sibling_list;
  } while( true );
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_debug("  %p disentangled from sibling %p\n",
				  wsi, wsi2);
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}